

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

int __thiscall util::log::logger::rotate_by_size(logger *this,sinker_internal *sinker)

{
  char cVar1;
  long lVar2;
  int iVar3;
  string new_file_name;
  time_t now;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  tm vtm;
  char string1 [128];
  
  lVar2 = std::ostream::tellp();
  iVar3 = 0;
  if ((long)(ulong)(sinker->sk).size <= lVar2) {
    std::ofstream::close();
    now = time((time_t *)0x0);
    string1[0x70] = '\0';
    string1[0x71] = '\0';
    string1[0x72] = '\0';
    string1[0x73] = '\0';
    string1[0x74] = '\0';
    string1[0x75] = '\0';
    string1[0x76] = '\0';
    string1[0x77] = '\0';
    string1[0x78] = '\0';
    string1[0x79] = '\0';
    string1[0x7a] = '\0';
    string1[0x7b] = '\0';
    string1[0x7c] = '\0';
    string1[0x7d] = '\0';
    string1[0x7e] = '\0';
    string1[0x7f] = '\0';
    string1[0x60] = '\0';
    string1[0x61] = '\0';
    string1[0x62] = '\0';
    string1[99] = '\0';
    string1[100] = '\0';
    string1[0x65] = '\0';
    string1[0x66] = '\0';
    string1[0x67] = '\0';
    string1[0x68] = '\0';
    string1[0x69] = '\0';
    string1[0x6a] = '\0';
    string1[0x6b] = '\0';
    string1[0x6c] = '\0';
    string1[0x6d] = '\0';
    string1[0x6e] = '\0';
    string1[0x6f] = '\0';
    string1[0x50] = '\0';
    string1[0x51] = '\0';
    string1[0x52] = '\0';
    string1[0x53] = '\0';
    string1[0x54] = '\0';
    string1[0x55] = '\0';
    string1[0x56] = '\0';
    string1[0x57] = '\0';
    string1[0x58] = '\0';
    string1[0x59] = '\0';
    string1[0x5a] = '\0';
    string1[0x5b] = '\0';
    string1[0x5c] = '\0';
    string1[0x5d] = '\0';
    string1[0x5e] = '\0';
    string1[0x5f] = '\0';
    string1[0x40] = '\0';
    string1[0x41] = '\0';
    string1[0x42] = '\0';
    string1[0x43] = '\0';
    string1[0x44] = '\0';
    string1[0x45] = '\0';
    string1[0x46] = '\0';
    string1[0x47] = '\0';
    string1[0x48] = '\0';
    string1[0x49] = '\0';
    string1[0x4a] = '\0';
    string1[0x4b] = '\0';
    string1[0x4c] = '\0';
    string1[0x4d] = '\0';
    string1[0x4e] = '\0';
    string1[0x4f] = '\0';
    string1[0x30] = '\0';
    string1[0x31] = '\0';
    string1[0x32] = '\0';
    string1[0x33] = '\0';
    string1[0x34] = '\0';
    string1[0x35] = '\0';
    string1[0x36] = '\0';
    string1[0x37] = '\0';
    string1[0x38] = '\0';
    string1[0x39] = '\0';
    string1[0x3a] = '\0';
    string1[0x3b] = '\0';
    string1[0x3c] = '\0';
    string1[0x3d] = '\0';
    string1[0x3e] = '\0';
    string1[0x3f] = '\0';
    string1[0x20] = '\0';
    string1[0x21] = '\0';
    string1[0x22] = '\0';
    string1[0x23] = '\0';
    string1[0x24] = '\0';
    string1[0x25] = '\0';
    string1[0x26] = '\0';
    string1[0x27] = '\0';
    string1[0x28] = '\0';
    string1[0x29] = '\0';
    string1[0x2a] = '\0';
    string1[0x2b] = '\0';
    string1[0x2c] = '\0';
    string1[0x2d] = '\0';
    string1[0x2e] = '\0';
    string1[0x2f] = '\0';
    string1[0x10] = '\0';
    string1[0x11] = '\0';
    string1[0x12] = '\0';
    string1[0x13] = '\0';
    string1[0x14] = '\0';
    string1[0x15] = '\0';
    string1[0x16] = '\0';
    string1[0x17] = '\0';
    string1[0x18] = '\0';
    string1[0x19] = '\0';
    string1[0x1a] = '\0';
    string1[0x1b] = '\0';
    string1[0x1c] = '\0';
    string1[0x1d] = '\0';
    string1[0x1e] = '\0';
    string1[0x1f] = '\0';
    string1[0] = '\0';
    string1[1] = '\0';
    string1[2] = '\0';
    string1[3] = '\0';
    string1[4] = '\0';
    string1[5] = '\0';
    string1[6] = '\0';
    string1[7] = '\0';
    string1[8] = '\0';
    string1[9] = '\0';
    string1[10] = '\0';
    string1[0xb] = '\0';
    string1[0xc] = '\0';
    string1[0xd] = '\0';
    string1[0xe] = '\0';
    string1[0xf] = '\0';
    localtime_r(&now,(tm *)&vtm);
    strftime(string1,0x80,"%Y%m%d%H%M%S",(tm *)&vtm);
    std::operator+(&local_100,&(sinker->sk).log_file,".");
    std::operator+(&new_file_name,&local_100,string1);
    std::__cxx11::string::~string((string *)&local_100);
    rename((sinker->sk).log_file._M_dataplus._M_p,new_file_name._M_dataplus._M_p);
    std::ofstream::open((char *)sinker->m_ofs,(_Ios_Openmode)(sinker->sk).log_file._M_dataplus._M_p)
    ;
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      iVar3 = -1;
    }
    else {
      sinker->cur_line = 0;
      iVar3 = 0;
    }
    std::__cxx11::string::~string((string *)&new_file_name);
  }
  return iVar3;
}

Assistant:

int logger::rotate_by_size(sinker_internal & sinker) {
            long cur_size = sinker.m_ofs->tellp();
            if (cur_size < sinker.sk.size) {
                return 0;
            }

            //1.close old log file
            sinker.m_ofs->close();

            //2.rename old log
            struct tm vtm;
            time_t now = time(0);
            char string1[128] = {0};
            localtime_r(&(now), &vtm);
            strftime(string1, 128, "%Y%m%d%H%M%S", &vtm);
            string new_file_name = sinker.sk.log_file + "." + string1;
#ifdef USE_BOOST
            rename(path(sinker.sk.log_file), path(new_file_name));
#else
            rename(sinker.sk.log_file.c_str(), new_file_name.c_str());
#endif
            //3.open new log file
            sinker.m_ofs->open(sinker.sk.log_file.c_str(), ios_base::out | ios_base::app);
            if (!sinker.m_ofs->is_open()) {
                return -1;
            }
            sinker.cur_line = 0;

            return 0;
        }